

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O3

bool __thiscall
deqp::gls::UniformBlockCase::compareStd140Blocks
          (UniformBlockCase *this,UniformLayout *refLayout,UniformLayout *cmpLayout)

{
  pointer pUVar1;
  ostringstream *this_00;
  ostringstream *poVar2;
  UniformBlock *pUVar3;
  pointer pBVar4;
  pointer pBVar5;
  pointer pUVar6;
  UniformLayout *pUVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  long *plVar11;
  int *piVar12;
  char *pcVar13;
  size_t sVar14;
  long *plVar15;
  int *piVar16;
  bool bVar17;
  string instanceName;
  allocator<char> local_209;
  TestLog *local_208;
  long *local_200;
  long local_1f8;
  long local_1f0;
  long lStack_1e8;
  vector<int,_std::allocator<int>_> *local_1e0;
  UniformLayout *local_1d8;
  UniformLayout *local_1d0;
  ulong local_1c8;
  UniformBlockCase *local_1c0;
  ulong local_1b8;
  undefined1 local_1b0 [16];
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  
  uVar10 = (uint)((ulong)((long)(this->m_interface).m_uniformBlocks.
                                super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_interface).m_uniformBlocks.
                               super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if ((int)uVar10 < 1) {
    bVar17 = true;
  }
  else {
    local_208 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    local_1c8 = (ulong)(uVar10 & 0x7fffffff);
    bVar17 = true;
    local_1b8 = 0;
    local_1d8 = cmpLayout;
    local_1d0 = refLayout;
    local_1c0 = this;
    do {
      pUVar3 = (local_1c0->m_interface).m_uniformBlocks.
               super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
               ._M_impl.super__Vector_impl_data._M_start[local_1b8];
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b0,(pUVar3->m_blockName)._M_dataplus._M_p,&local_209);
      plVar11 = (long *)std::__cxx11::string::append((char *)local_1b0);
      pUVar7 = local_1d8;
      local_200 = &local_1f0;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_1f0 = *plVar15;
        lStack_1e8 = plVar11[3];
      }
      else {
        local_1f0 = *plVar15;
        local_200 = (long *)*plVar11;
      }
      local_1f8 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      if ((TestLog *)local_1b0._0_8_ != local_1a0) {
        operator_delete((void *)local_1b0._0_8_,(ulong)((long)&(local_1a0[0].m_log)->flags + 1));
      }
      iVar8 = ub::UniformLayout::getBlockIndex(local_1d0,(char *)local_200);
      uVar9 = ub::UniformLayout::getBlockIndex(pUVar7,(char *)local_200);
      uVar10 = pUVar3->m_flags;
      if ((uVar10 & 0x20) != 0) {
        if ((int)uVar9 < 0) {
          if ((uVar10 & 0x300) != 0) {
            local_1b0._0_8_ = local_208;
            poVar2 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar2,"Error: Uniform block \'",0x16);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar2,(char *)local_200,local_1f8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\' not found",0xb)
            ;
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar2);
            std::ios_base::~ios_base(local_138);
            bVar17 = false;
          }
        }
        else {
          pBVar4 = (local_1d0->blocks).
                   super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pBVar5 = (pUVar7->blocks).
                   super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_1e0 = &pBVar4[iVar8].activeUniformIndices;
          piVar16 = *(int **)&(local_1e0->super__Vector_base<int,_std::allocator<int>_>)._M_impl;
          piVar12 = *(pointer *)
                     ((long)&pBVar4[iVar8].activeUniformIndices.
                             super__Vector_base<int,_std::allocator<int>_> + 8);
          if ((long)piVar12 - (long)piVar16 !=
              (long)*(pointer *)
                     ((long)&pBVar5[uVar9].activeUniformIndices.
                             super__Vector_base<int,_std::allocator<int>_> + 8) -
              *(long *)&pBVar5[uVar9].activeUniformIndices.
                        super__Vector_base<int,_std::allocator<int>_>) {
            local_1b0._0_8_ = local_208;
            std::__cxx11::ostringstream::ostringstream(this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"Error: Number of active uniforms differ in block \'",0x32
                      );
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,(char *)local_200,local_1f8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"\' (expected ",0xc);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", got ",6);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(this_00);
            std::ios_base::~ios_base(local_138);
            piVar16 = *(int **)&(local_1e0->super__Vector_base<int,_std::allocator<int>_>)._M_impl;
            piVar12 = *(pointer *)
                       ((long)&(local_1e0->super__Vector_base<int,_std::allocator<int>_>)._M_impl +
                       8);
            bVar17 = false;
          }
          if (piVar16 != piVar12) {
            do {
              pUVar7 = local_1d8;
              pUVar6 = (local_1d0->uniforms).
                       super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pUVar1 = pUVar6 + *piVar16;
              uVar10 = ub::UniformLayout::getUniformIndex
                                 (local_1d8,pUVar6[*piVar16].name._M_dataplus._M_p);
              if ((int)uVar10 < 0) {
                local_1b0._0_8_ = local_208;
                poVar2 = (ostringstream *)(local_1b0 + 8);
                std::__cxx11::ostringstream::ostringstream(poVar2);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar2,"Error: Uniform \'",0x10);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar2,(pUVar1->name)._M_dataplus._M_p,
                           (pUVar1->name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar2,"\' not found",0xb);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
LAB_00936214:
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
                std::ios_base::~ios_base(local_138);
                bVar17 = false;
              }
              else {
                pUVar6 = (pUVar7->uniforms).
                         super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if ((((pUVar1->type != pUVar6[uVar10].type) || (pUVar1->size != pUVar6[uVar10].size)
                     ) || (pUVar1->offset != pUVar6[uVar10].offset)) ||
                   (((pUVar1->arrayStride != pUVar6[uVar10].arrayStride ||
                     (pUVar1->matrixStride != pUVar6[uVar10].matrixStride)) ||
                    (pUVar1->isRowMajor != pUVar6[uVar10].isRowMajor)))) {
                  local_1b0._0_8_ = local_208;
                  std::__cxx11::ostringstream::ostringstream(this_00);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_00,"Error: Layout mismatch in \'",0x1b);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_00,(pUVar1->name)._M_dataplus._M_p,
                             (pUVar1->name)._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\':\n",3);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_00,"  expected: type = ",0x13);
                  pcVar13 = glu::getDataTypeName(pUVar1->type);
                  if (pcVar13 == (char *)0x0) {
                    std::ios::clear((int)this_00 + (int)*(undefined8 *)(local_1b0._8_8_ + -0x18));
                  }
                  else {
                    sVar14 = strlen(pcVar13);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,pcVar13,sVar14);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_00,", size = ",9);
                  std::ostream::operator<<(this_00,pUVar1->size);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_00,", offset = ",0xb);
                  std::ostream::operator<<(this_00,pUVar1->offset);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_00,", array stride = ",0x11);
                  std::ostream::operator<<(this_00,pUVar1->arrayStride);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_00,", matrix stride = ",0x12);
                  std::ostream::operator<<(this_00,pUVar1->matrixStride);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_00,", row major = ",0xe);
                  pcVar13 = "false";
                  if ((ulong)pUVar1->isRowMajor != 0) {
                    pcVar13 = "true";
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_00,pcVar13,(ulong)pUVar1->isRowMajor ^ 5);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_00,"  got: type = ",0xe);
                  pcVar13 = glu::getDataTypeName(pUVar6[uVar10].type);
                  if (pcVar13 == (char *)0x0) {
                    std::ios::clear((int)this_00 + (int)*(undefined8 *)(local_1b0._8_8_ + -0x18));
                  }
                  else {
                    sVar14 = strlen(pcVar13);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,pcVar13,sVar14);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_00,", size = ",9);
                  std::ostream::operator<<(this_00,pUVar6[uVar10].size);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_00,", offset = ",0xb);
                  std::ostream::operator<<(this_00,pUVar6[uVar10].offset);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_00,", array stride = ",0x11);
                  std::ostream::operator<<(this_00,pUVar6[uVar10].arrayStride);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_00,", matrix stride = ",0x12);
                  std::ostream::operator<<(this_00,pUVar6[uVar10].matrixStride);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_00,", row major = ",0xe);
                  pcVar13 = "false";
                  if ((ulong)pUVar6[uVar10].isRowMajor != 0) {
                    pcVar13 = "true";
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_00,pcVar13,(ulong)pUVar6[uVar10].isRowMajor ^ 5);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1b0,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                  goto LAB_00936214;
                }
              }
              piVar16 = piVar16 + 1;
            } while (piVar16 !=
                     *(pointer *)
                      ((long)&(local_1e0->super__Vector_base<int,_std::allocator<int>_>)._M_impl + 8
                      ));
          }
        }
      }
      if (local_200 != &local_1f0) {
        operator_delete(local_200,local_1f0 + 1);
      }
      local_1b8 = local_1b8 + 1;
    } while (local_1b8 != local_1c8);
  }
  return bVar17;
}

Assistant:

bool UniformBlockCase::compareStd140Blocks (const UniformLayout& refLayout, const UniformLayout& cmpLayout) const
{
	TestLog&	log			= m_testCtx.getLog();
	bool		isOk		= true;
	int			numBlocks	= m_interface.getNumUniformBlocks();

	for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
	{
		const UniformBlock&		block			= m_interface.getUniformBlock(blockNdx);
		bool					isArray			= block.isArray();
		std::string				instanceName	= string(block.getBlockName()) + (isArray ? "[0]" : "");
		int						refBlockNdx		= refLayout.getBlockIndex(instanceName.c_str());
		int						cmpBlockNdx		= cmpLayout.getBlockIndex(instanceName.c_str());
		bool					isUsed			= (block.getFlags() & (DECLARE_VERTEX|DECLARE_FRAGMENT)) != 0;

		if ((block.getFlags() & LAYOUT_STD140) == 0)
			continue; // Not std140 layout.

		DE_ASSERT(refBlockNdx >= 0);

		if (cmpBlockNdx < 0)
		{
			// Not found, should it?
			if (isUsed)
			{
				log << TestLog::Message << "Error: Uniform block '" << instanceName << "' not found" << TestLog::EndMessage;
				isOk = false;
			}

			continue; // Skip block.
		}

		const BlockLayoutEntry&		refBlockLayout	= refLayout.blocks[refBlockNdx];
		const BlockLayoutEntry&		cmpBlockLayout	= cmpLayout.blocks[cmpBlockNdx];

		// \todo [2012-01-24 pyry] Verify that activeUniformIndices is correct.
		// \todo [2012-01-24 pyry] Verify all instances.
		if (refBlockLayout.activeUniformIndices.size() != cmpBlockLayout.activeUniformIndices.size())
		{
			log << TestLog::Message << "Error: Number of active uniforms differ in block '" << instanceName
				<< "' (expected " << refBlockLayout.activeUniformIndices.size()
				<< ", got " << cmpBlockLayout.activeUniformIndices.size()
				<< ")" << TestLog::EndMessage;
			isOk = false;
		}

		for (vector<int>::const_iterator ndxIter = refBlockLayout.activeUniformIndices.begin(); ndxIter != refBlockLayout.activeUniformIndices.end(); ndxIter++)
		{
			const UniformLayoutEntry&	refEntry	= refLayout.uniforms[*ndxIter];
			int							cmpEntryNdx	= cmpLayout.getUniformIndex(refEntry.name.c_str());

			if (cmpEntryNdx < 0)
			{
				log << TestLog::Message << "Error: Uniform '" << refEntry.name << "' not found" << TestLog::EndMessage;
				isOk = false;
				continue;
			}

			const UniformLayoutEntry&	cmpEntry	= cmpLayout.uniforms[cmpEntryNdx];

			if (refEntry.type			!= cmpEntry.type			||
				refEntry.size			!= cmpEntry.size			||
				refEntry.offset			!= cmpEntry.offset			||
				refEntry.arrayStride	!= cmpEntry.arrayStride		||
				refEntry.matrixStride	!= cmpEntry.matrixStride	||
				refEntry.isRowMajor		!= cmpEntry.isRowMajor)
			{
				log << TestLog::Message << "Error: Layout mismatch in '" << refEntry.name << "':\n"
					<< "  expected: type = " << glu::getDataTypeName(refEntry.type) << ", size = " << refEntry.size << ", offset = " << refEntry.offset << ", array stride = "<< refEntry.arrayStride << ", matrix stride = " << refEntry.matrixStride << ", row major = " << (refEntry.isRowMajor ? "true" : "false") << "\n"
					<< "  got: type = " << glu::getDataTypeName(cmpEntry.type) << ", size = " << cmpEntry.size << ", offset = " << cmpEntry.offset << ", array stride = "<< cmpEntry.arrayStride << ", matrix stride = " << cmpEntry.matrixStride << ", row major = " << (cmpEntry.isRowMajor ? "true" : "false")
					<< TestLog::EndMessage;
				isOk = false;
			}
		}
	}

	return isOk;
}